

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorK<4>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  float fVar1;
  ulong *puVar4;
  ulong *puVar5;
  ulong *puVar6;
  undefined4 uVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  NodeRef nodeRef;
  Primitive_conflict4 *prim;
  ulong *puVar24;
  bool bVar25;
  byte bVar26;
  ulong uVar27;
  float fVar28;
  float fVar59;
  float fVar60;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar61;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar65 [64];
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [16];
  vint4 ai;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vint4 ai_1;
  undefined1 auVar73 [16];
  vint4 ai_3;
  undefined1 auVar74 [16];
  vint4 bi;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 bi_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  vint4 bi_3;
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  vint4 ai_2;
  vint4 bi_2;
  undefined1 auVar83 [64];
  int in_XMM10_Da;
  int in_XMM10_Db;
  int in_XMM10_Dc;
  int in_XMM10_Dd;
  undefined1 auVar84 [64];
  int in_XMM11_Da;
  int in_XMM11_Db;
  int in_XMM11_Dc;
  int in_XMM11_Dd;
  undefined1 auVar85 [64];
  int in_XMM12_Da;
  int in_XMM12_Db;
  int in_XMM12_Dc;
  int in_XMM12_Dd;
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  Precalculations pre;
  vbool<4>_conflict valid_leaf;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_26a1;
  ulong local_26a0;
  ulong uStack_2698;
  float local_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  undefined1 local_2680 [16];
  AccelData *local_2670;
  ulong local_2668;
  long local_2660;
  long local_2658;
  RayHitK<4> *local_2650;
  RayQueryContext *local_2648;
  long local_2640;
  long local_2638;
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  uint local_2610 [4];
  vbool<4>_conflict local_2600 [32];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  float local_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  undefined1 auVar32 [16];
  
  auVar36 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  local_2668 = vpcmpeqd_avx512vl(auVar36,(undefined1  [16])valid_i->field_0);
  local_2668 = local_2668 & 0xf;
  if ((byte)local_2668 == 0) {
    return;
  }
  local_2670 = This->ptr;
  local_25c0 = *(undefined1 (*) [16])(ray + 0x20);
  auVar83 = ZEXT1664(local_25c0);
  auVar35 = *(undefined1 (*) [16])(ray + 0x40);
  auVar33._8_4_ = 0x7fffffff;
  auVar33._0_8_ = 0x7fffffff7fffffff;
  auVar33._12_4_ = 0x7fffffff;
  auVar29 = vandps_avx(auVar35,auVar33);
  auVar75._8_4_ = 0x219392ef;
  auVar75._0_8_ = 0x219392ef219392ef;
  auVar75._12_4_ = 0x219392ef;
  uVar17 = vcmpps_avx512vl(auVar29,auVar75,1);
  auVar29 = vblendmps_avx512vl(auVar35,auVar75);
  bVar25 = (bool)((byte)uVar17 & 1);
  auVar34._0_4_ = (uint)bVar25 * auVar29._0_4_ | (uint)!bVar25 * in_XMM10_Da;
  bVar25 = (bool)((byte)(uVar17 >> 1) & 1);
  auVar34._4_4_ = (uint)bVar25 * auVar29._4_4_ | (uint)!bVar25 * in_XMM10_Db;
  bVar25 = (bool)((byte)(uVar17 >> 2) & 1);
  auVar34._8_4_ = (uint)bVar25 * auVar29._8_4_ | (uint)!bVar25 * in_XMM10_Dc;
  bVar25 = (bool)((byte)(uVar17 >> 3) & 1);
  auVar34._12_4_ = (uint)bVar25 * auVar29._12_4_ | (uint)!bVar25 * in_XMM10_Dd;
  auVar29 = *(undefined1 (*) [16])(ray + 0x50);
  auVar30 = vandps_avx(auVar29,auVar33);
  uVar17 = vcmpps_avx512vl(auVar30,auVar75,1);
  auVar30 = vblendmps_avx512vl(auVar29,auVar75);
  bVar25 = (bool)((byte)uVar17 & 1);
  auVar53._0_4_ = (uint)bVar25 * auVar30._0_4_ | (uint)!bVar25 * in_XMM11_Da;
  bVar25 = (bool)((byte)(uVar17 >> 1) & 1);
  auVar53._4_4_ = (uint)bVar25 * auVar30._4_4_ | (uint)!bVar25 * in_XMM11_Db;
  bVar25 = (bool)((byte)(uVar17 >> 2) & 1);
  auVar53._8_4_ = (uint)bVar25 * auVar30._8_4_ | (uint)!bVar25 * in_XMM11_Dc;
  bVar25 = (bool)((byte)(uVar17 >> 3) & 1);
  auVar53._12_4_ = (uint)bVar25 * auVar30._12_4_ | (uint)!bVar25 * in_XMM11_Dd;
  auVar30 = *(undefined1 (*) [16])(ray + 0x60);
  auVar31 = vandps_avx(auVar30,auVar33);
  uVar17 = vcmpps_avx512vl(auVar31,auVar75,1);
  auVar31 = vblendmps_avx512vl(auVar30,auVar75);
  bVar25 = (bool)((byte)uVar17 & 1);
  auVar32._0_4_ = (uint)bVar25 * auVar31._0_4_ | (uint)!bVar25 * in_XMM12_Da;
  bVar25 = (bool)((byte)(uVar17 >> 1) & 1);
  auVar32._4_4_ = (uint)bVar25 * auVar31._4_4_ | (uint)!bVar25 * in_XMM12_Db;
  bVar25 = (bool)((byte)(uVar17 >> 2) & 1);
  auVar32._8_4_ = (uint)bVar25 * auVar31._8_4_ | (uint)!bVar25 * in_XMM12_Dc;
  bVar25 = (bool)((byte)(uVar17 >> 3) & 1);
  auVar32._12_4_ = (uint)bVar25 * auVar31._12_4_ | (uint)!bVar25 * in_XMM12_Dd;
  auVar33 = vrcp14ps_avx512vl(auVar34);
  auVar75 = ZEXT816(0) << 0x40;
  auVar76._8_4_ = 0x3f800000;
  auVar76._0_8_ = 0x3f8000003f800000;
  auVar76._12_4_ = 0x3f800000;
  auVar31 = vfnmadd213ps_fma(auVar34,auVar33,auVar76);
  local_2680 = vfmadd132ps_fma(auVar31,auVar33,auVar33);
  auVar84 = ZEXT1664(local_2680);
  auVar34 = vrcp14ps_avx512vl(auVar53);
  auVar31 = vfnmadd213ps_fma(auVar53,auVar34,auVar76);
  local_2560 = vfmadd132ps_fma(auVar31,auVar34,auVar34);
  auVar85 = ZEXT1664(local_2560);
  auVar34 = vrcp14ps_avx512vl(auVar32);
  auVar31 = vfnmadd213ps_fma(auVar32,auVar34,auVar76);
  local_2570 = vfmadd132ps_fma(auVar31,auVar34,auVar34);
  auVar86 = ZEXT1664(local_2570);
  local_25d0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar75);
  auVar35 = vcmpps_avx(auVar35,auVar75,1);
  auVar31._8_4_ = 1;
  auVar31._0_8_ = 0x100000001;
  auVar31._12_4_ = 1;
  auVar31 = vandps_avx512vl(auVar35,auVar31);
  uVar17 = vcmpps_avx512vl(auVar29,auVar75,1);
  auVar51._8_4_ = 2;
  auVar51._0_8_ = 0x200000002;
  auVar51._12_4_ = 2;
  auVar35 = vpsubd_avx512vl(auVar51,auVar35);
  bVar25 = (bool)((byte)uVar17 & 1);
  auVar29._0_4_ = (uint)bVar25 * auVar35._0_4_ | (uint)!bVar25 * auVar31._0_4_;
  bVar25 = (bool)((byte)(uVar17 >> 1) & 1);
  auVar29._4_4_ = (uint)bVar25 * auVar35._4_4_ | (uint)!bVar25 * auVar31._4_4_;
  bVar25 = (bool)((byte)(uVar17 >> 2) & 1);
  auVar29._8_4_ = (uint)bVar25 * auVar35._8_4_ | (uint)!bVar25 * auVar31._8_4_;
  bVar25 = (bool)((byte)(uVar17 >> 3) & 1);
  auVar29._12_4_ = (uint)bVar25 * auVar35._12_4_ | (uint)!bVar25 * auVar31._12_4_;
  uVar17 = vcmpps_avx512vl(auVar30,auVar75,1);
  auVar35._8_4_ = 4;
  auVar35._0_8_ = 0x400000004;
  auVar35._12_4_ = 4;
  auVar35 = vpord_avx512vl(auVar29,auVar35);
  bVar25 = (bool)((byte)uVar17 & 1);
  auVar30._0_4_ = (uint)bVar25 * auVar35._0_4_ | !bVar25 * auVar29._0_4_;
  bVar25 = (bool)((byte)(uVar17 >> 1) & 1);
  auVar30._4_4_ = (uint)bVar25 * auVar35._4_4_ | !bVar25 * auVar29._4_4_;
  bVar25 = (bool)((byte)(uVar17 >> 2) & 1);
  auVar30._8_4_ = (uint)bVar25 * auVar35._8_4_ | !bVar25 * auVar29._8_4_;
  bVar25 = (bool)((byte)(uVar17 >> 3) & 1);
  auVar30._12_4_ = (uint)bVar25 * auVar35._12_4_ | !bVar25 * auVar29._12_4_;
  local_25e0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar75);
  auVar35 = vmovdqa32_avx512vl(auVar30);
  bVar25 = (bool)((byte)local_2668 & 1);
  bVar9 = (bool)((byte)(local_2668 >> 1) & 1);
  bVar10 = (bool)((byte)(local_2668 >> 2) & 1);
  bVar11 = SUB81(local_2668 >> 3,0);
  local_2610[0] = (uint)bVar25 * auVar35._0_4_ | (uint)!bVar25 * auVar36._0_4_;
  local_2610[1] = (uint)bVar9 * auVar35._4_4_ | (uint)!bVar9 * auVar36._4_4_;
  local_2610[2] = (uint)bVar10 * auVar35._8_4_ | (uint)!bVar10 * auVar36._8_4_;
  local_2610[3] = (uint)bVar11 * auVar35._12_4_ | (uint)!bVar11 * auVar36._12_4_;
  local_25a0 = *(float *)ray;
  fStack_259c = *(float *)(ray + 4);
  fStack_2598 = *(float *)(ray + 8);
  fStack_2594 = *(float *)(ray + 0xc);
  local_2690 = local_2680._0_4_ * -*(float *)ray;
  fStack_268c = local_2680._4_4_ * -*(float *)(ray + 4);
  fStack_2688 = local_2680._8_4_ * -*(float *)(ray + 8);
  fStack_2684 = local_2680._12_4_ * -*(float *)(ray + 0xc);
  local_25b0 = *(float *)(ray + 0x10);
  fStack_25ac = *(float *)(ray + 0x14);
  fStack_25a8 = *(float *)(ray + 0x18);
  fStack_25a4 = *(float *)(ray + 0x1c);
  local_2580._0_4_ = local_2560._0_4_ * -*(float *)(ray + 0x10);
  local_2580._4_4_ = local_2560._4_4_ * -*(float *)(ray + 0x14);
  local_2580._8_4_ = local_2560._8_4_ * -*(float *)(ray + 0x18);
  local_2580._12_4_ = local_2560._12_4_ * -*(float *)(ray + 0x1c);
  auVar88 = ZEXT1664(local_2580);
  local_2590._0_4_ = local_2570._0_4_ * -local_25c0._0_4_;
  local_2590._4_4_ = local_2570._4_4_ * -local_25c0._4_4_;
  local_2590._8_4_ = local_2570._8_4_ * -local_25c0._8_4_;
  local_2590._12_4_ = local_2570._12_4_ * -local_25c0._12_4_;
  auVar89 = ZEXT1664(local_2590);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar90 = ZEXT1664(auVar36);
  local_2650 = ray;
  local_2648 = context;
LAB_01dc4960:
  lVar22 = 0;
  for (uVar17 = local_2668; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  uVar21 = local_2610[lVar22];
  auVar62._4_4_ = uVar21;
  auVar62._0_4_ = uVar21;
  auVar62._8_4_ = uVar21;
  auVar62._12_4_ = uVar21;
  auVar36._4_4_ = local_2610[1];
  auVar36._0_4_ = local_2610[0];
  auVar36._8_4_ = local_2610[2];
  auVar36._12_4_ = local_2610[3];
  uVar27 = vpcmpeqd_avx512vl(auVar62,auVar36);
  uVar27 = uVar27 & 0xf;
  bVar26 = (byte)uVar27;
  local_2668 = (long)(char)~bVar26 & local_2668;
  auVar16._4_4_ = fStack_259c;
  auVar16._0_4_ = local_25a0;
  auVar16._8_4_ = fStack_2598;
  auVar16._12_4_ = fStack_2594;
  auVar53 = auVar90._0_16_;
  auVar36 = vblendmps_avx512vl(auVar53,auVar16);
  auVar37._0_4_ = (uint)(bVar26 & 1) * auVar36._0_4_ | !(bool)(bVar26 & 1) * uVar21;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar37._4_4_ = (uint)bVar25 * auVar36._4_4_ | !bVar25 * uVar21;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar37._8_4_ = (uint)bVar25 * auVar36._8_4_ | !bVar25 * uVar21;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar37._12_4_ = (uint)bVar25 * auVar36._12_4_ | !bVar25 * uVar21;
  auVar36 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar35 = vshufpd_avx(auVar36,auVar36,1);
  auVar36 = vminps_avx(auVar35,auVar36);
  auVar15._4_4_ = fStack_25ac;
  auVar15._0_4_ = local_25b0;
  auVar15._8_4_ = fStack_25a8;
  auVar15._12_4_ = fStack_25a4;
  auVar29 = vblendmps_avx512vl(auVar53,auVar15);
  auVar38._0_4_ = (uint)(bVar26 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar35._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar25 * auVar29._4_4_ | (uint)!bVar25 * auVar35._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar25 * auVar29._8_4_ | (uint)!bVar25 * auVar35._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar38._12_4_ = (uint)bVar25 * auVar29._12_4_ | (uint)!bVar25 * auVar35._12_4_;
  auVar35 = vshufps_avx(auVar38,auVar38,0xb1);
  auVar35 = vminps_avx(auVar35,auVar38);
  auVar29 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vminps_avx(auVar29,auVar35);
  auVar36 = vinsertps_avx(auVar36,auVar35,0x1c);
  auVar29 = vblendmps_avx512vl(auVar53,local_25c0);
  auVar39._0_4_ = (uint)(bVar26 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar35._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar25 * auVar29._4_4_ | (uint)!bVar25 * auVar35._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar25 * auVar29._8_4_ | (uint)!bVar25 * auVar35._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar39._12_4_ = (uint)bVar25 * auVar29._12_4_ | (uint)!bVar25 * auVar35._12_4_;
  auVar35 = vshufps_avx(auVar39,auVar39,0xb1);
  auVar35 = vminps_avx(auVar35,auVar39);
  auVar29 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vminps_avx(auVar29,auVar35);
  auVar35 = vinsertps_avx(auVar36,auVar35,0x20);
  auVar78._8_4_ = 0xff800000;
  auVar78._0_8_ = 0xff800000ff800000;
  auVar78._12_4_ = 0xff800000;
  auVar29 = vblendmps_avx512vl(auVar78,auVar16);
  auVar40._0_4_ = (uint)(bVar26 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar36._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar25 * auVar29._4_4_ | (uint)!bVar25 * auVar36._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar25 * auVar29._8_4_ | (uint)!bVar25 * auVar36._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar40._12_4_ = (uint)bVar25 * auVar29._12_4_ | (uint)!bVar25 * auVar36._12_4_;
  auVar36 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar40);
  auVar29 = vshufpd_avx(auVar36,auVar36,1);
  auVar36 = vmaxps_avx(auVar29,auVar36);
  auVar30 = vblendmps_avx512vl(auVar78,auVar15);
  auVar41._0_4_ = (uint)(bVar26 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar29._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar25 * auVar30._4_4_ | (uint)!bVar25 * auVar29._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar25 * auVar30._8_4_ | (uint)!bVar25 * auVar29._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar41._12_4_ = (uint)bVar25 * auVar30._12_4_ | (uint)!bVar25 * auVar29._12_4_;
  auVar29 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar29 = vmaxps_avx(auVar29,auVar41);
  auVar30 = vshufpd_avx(auVar29,auVar29,1);
  auVar29 = vmaxps_avx(auVar30,auVar29);
  auVar36 = vinsertps_avx(auVar36,auVar29,0x1c);
  auVar30 = vblendmps_avx512vl(auVar78,local_25c0);
  auVar42._0_4_ = (uint)(bVar26 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar29._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar25 * auVar30._4_4_ | (uint)!bVar25 * auVar29._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar25 * auVar30._8_4_ | (uint)!bVar25 * auVar29._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar42._12_4_ = (uint)bVar25 * auVar30._12_4_ | (uint)!bVar25 * auVar29._12_4_;
  auVar29 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar29 = vmaxps_avx(auVar29,auVar42);
  auVar30 = vshufpd_avx(auVar29,auVar29,1);
  auVar29 = vmaxps_avx(auVar30,auVar29);
  auVar29 = vinsertps_avx(auVar36,auVar29,0x20);
  auVar30 = vblendmps_avx512vl(auVar53,auVar84._0_16_);
  auVar43._0_4_ = (uint)(bVar26 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar36._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar25 * auVar30._4_4_ | (uint)!bVar25 * auVar36._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar25 * auVar30._8_4_ | (uint)!bVar25 * auVar36._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar43._12_4_ = (uint)bVar25 * auVar30._12_4_ | (uint)!bVar25 * auVar36._12_4_;
  auVar36 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar36 = vminps_avx(auVar36,auVar43);
  auVar30 = vshufpd_avx(auVar36,auVar36,1);
  auVar36 = vminps_avx(auVar30,auVar36);
  auVar31 = vblendmps_avx512vl(auVar53,auVar85._0_16_);
  auVar44._0_4_ = (uint)(bVar26 & 1) * auVar31._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar30._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar25 * auVar31._4_4_ | (uint)!bVar25 * auVar30._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar25 * auVar31._8_4_ | (uint)!bVar25 * auVar30._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar44._12_4_ = (uint)bVar25 * auVar31._12_4_ | (uint)!bVar25 * auVar30._12_4_;
  auVar30 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar30 = vminps_avx(auVar30,auVar44);
  auVar31 = vshufpd_avx(auVar30,auVar30,1);
  auVar30 = vminps_avx(auVar31,auVar30);
  auVar36 = vinsertps_avx(auVar36,auVar30,0x1c);
  auVar31 = vblendmps_avx512vl(auVar53,auVar86._0_16_);
  auVar45._0_4_ = (uint)(bVar26 & 1) * auVar31._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar30._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar25 * auVar31._4_4_ | (uint)!bVar25 * auVar30._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar25 * auVar31._8_4_ | (uint)!bVar25 * auVar30._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar45._12_4_ = (uint)bVar25 * auVar31._12_4_ | (uint)!bVar25 * auVar30._12_4_;
  auVar30 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar30 = vminps_avx(auVar30,auVar45);
  auVar31 = vshufpd_avx(auVar30,auVar30,1);
  auVar30 = vminps_avx(auVar31,auVar30);
  auVar36 = vinsertps_avx(auVar36,auVar30,0x20);
  auVar31 = vblendmps_avx512vl(auVar78,auVar84._0_16_);
  auVar46._0_4_ = (uint)(bVar26 & 1) * auVar31._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar30._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar25 * auVar31._4_4_ | (uint)!bVar25 * auVar30._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar25 * auVar31._8_4_ | (uint)!bVar25 * auVar30._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar46._12_4_ = (uint)bVar25 * auVar31._12_4_ | (uint)!bVar25 * auVar30._12_4_;
  auVar30 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar30 = vmaxps_avx(auVar30,auVar46);
  auVar31 = vshufpd_avx(auVar30,auVar30,1);
  auVar30 = vmaxps_avx(auVar31,auVar30);
  auVar34 = vblendmps_avx512vl(auVar78,auVar85._0_16_);
  auVar47._0_4_ = (uint)(bVar26 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar31._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar25 * auVar34._4_4_ | (uint)!bVar25 * auVar31._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar25 * auVar34._8_4_ | (uint)!bVar25 * auVar31._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar47._12_4_ = (uint)bVar25 * auVar34._12_4_ | (uint)!bVar25 * auVar31._12_4_;
  auVar31 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar31 = vmaxps_avx(auVar31,auVar47);
  auVar34 = vshufpd_avx(auVar31,auVar31,1);
  auVar31 = vmaxps_avx(auVar34,auVar31);
  auVar30 = vinsertps_avx(auVar30,auVar31,0x1c);
  auVar34 = vblendmps_avx512vl(auVar78,auVar86._0_16_);
  auVar48._0_4_ = (uint)(bVar26 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar31._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar25 * auVar34._4_4_ | (uint)!bVar25 * auVar31._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar25 * auVar34._8_4_ | (uint)!bVar25 * auVar31._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar48._12_4_ = (uint)bVar25 * auVar34._12_4_ | (uint)!bVar25 * auVar31._12_4_;
  auVar31 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar31 = vmaxps_avx(auVar31,auVar48);
  auVar34 = vshufpd_avx(auVar31,auVar31,1);
  auVar31 = vmaxps_avx(auVar34,auVar31);
  auVar30 = vinsertps_avx(auVar30,auVar31,0x20);
  auVar34 = vblendmps_avx512vl(auVar53,local_25d0);
  auVar49._0_4_ = (uint)(bVar26 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar31._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar25 * auVar34._4_4_ | (uint)!bVar25 * auVar31._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar25 * auVar34._8_4_ | (uint)!bVar25 * auVar31._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar49._12_4_ = (uint)bVar25 * auVar34._12_4_ | (uint)!bVar25 * auVar31._12_4_;
  auVar31 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar31 = vminps_avx(auVar31,auVar49);
  auVar53 = vshufpd_avx(auVar31,auVar31,1);
  auVar34 = vblendmps_avx512vl(auVar78,local_25e0);
  auVar50._0_4_ = (uint)(bVar26 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar26 & 1) * in_ZMM18._0_4_;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar25 * auVar34._4_4_ | (uint)!bVar25 * in_ZMM18._4_4_;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar25 * auVar34._8_4_ | (uint)!bVar25 * in_ZMM18._8_4_;
  bVar25 = SUB81(uVar27 >> 3,0);
  auVar50._12_4_ = (uint)bVar25 * auVar34._12_4_ | (uint)!bVar25 * in_ZMM18._12_4_;
  in_ZMM18 = ZEXT1664(auVar50);
  auVar34 = vshufps_avx512vl(auVar50,auVar50,0xb1);
  auVar51 = vmaxps_avx512vl(auVar34,auVar50);
  auVar32 = vshufpd_avx(auVar51,auVar51,1);
  uVar17 = vcmpps_avx512vl(auVar36,ZEXT816(0) << 0x40,5);
  auVar34 = vblendmps_avx512vl(auVar30,auVar36);
  bVar8 = (byte)uVar17;
  fVar66 = (float)((uint)(bVar8 & 1) * auVar34._0_4_);
  fVar1 = (float)((uint)((byte)(uVar17 >> 1) & 1) * auVar34._4_4_);
  auVar52._4_4_ = fVar1;
  auVar52._0_4_ = fVar66;
  fVar2 = (float)((uint)((byte)(uVar17 >> 2) & 1) * auVar34._8_4_);
  auVar52._8_4_ = fVar2;
  fVar3 = (float)((uint)((byte)(uVar17 >> 3) & 1) * auVar34._12_4_);
  auVar52._12_4_ = fVar3;
  auVar34 = vblendmps_avx512vl(auVar35,auVar29);
  fVar28 = (float)((uint)(bVar8 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar83._0_4_);
  bVar25 = (bool)((byte)(uVar17 >> 1) & 1);
  fVar59 = (float)((uint)bVar25 * auVar34._4_4_ | (uint)!bVar25 * auVar83._4_4_);
  bVar25 = (bool)((byte)(uVar17 >> 2) & 1);
  fVar60 = (float)((uint)bVar25 * auVar34._8_4_ | (uint)!bVar25 * auVar83._8_4_);
  bVar25 = (bool)((byte)(uVar17 >> 3) & 1);
  fVar61 = (float)((uint)bVar25 * auVar34._12_4_ | (uint)!bVar25 * auVar83._12_4_);
  auVar83 = ZEXT1664(CONCAT412(fVar61,CONCAT48(fVar60,CONCAT44(fVar59,fVar28))));
  bVar25 = (bool)((byte)(uVar17 >> 1) & 1);
  bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
  bVar11 = (bool)((byte)(uVar17 >> 3) & 1);
  vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  vucomiss_avx512f(auVar52);
  auVar34 = vmovshdup_avx(auVar52);
  vucomiss_avx512f(auVar34);
  auVar33 = vshufpd_avx(auVar52,auVar52,1);
  vucomiss_avx512f(auVar33);
  auVar84 = ZEXT1664(local_2680);
  local_2638 = 0x60;
  auVar31 = vminps_avx(auVar53,auVar31);
  auVar53 = vmaxss_avx512f(auVar32,auVar51);
  auVar54._0_4_ =
       (float)((uint)(bVar8 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar36._0_4_);
  bVar9 = (bool)((byte)(uVar17 >> 1) & 1);
  auVar54._4_4_ = (float)((uint)bVar9 * auVar30._4_4_ | (uint)!bVar9 * auVar36._4_4_);
  bVar9 = (bool)((byte)(uVar17 >> 2) & 1);
  auVar54._8_4_ = (float)((uint)bVar9 * auVar30._8_4_ | (uint)!bVar9 * auVar36._8_4_);
  bVar9 = (bool)((byte)(uVar17 >> 3) & 1);
  auVar54._12_4_ = (float)((uint)bVar9 * auVar30._12_4_ | (uint)!bVar9 * auVar36._12_4_);
  fVar28 = fVar28 * fVar66;
  fVar66 = (float)((uint)(bVar8 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar29._0_4_) *
           auVar54._0_4_;
  fVar68 = (float)((uint)bVar25 * auVar35._4_4_ | (uint)!bVar25 * auVar29._4_4_) * auVar54._4_4_;
  fVar69 = (float)((uint)bVar10 * auVar35._8_4_ | (uint)!bVar10 * auVar29._8_4_) * auVar54._8_4_;
  fVar70 = (float)((uint)bVar11 * auVar35._12_4_ | (uint)!bVar11 * auVar29._12_4_) * auVar54._12_4_;
  local_23a0 = *(ulong *)&local_2670[1].bounds.bounds0.lower.field_0;
  local_2398[0] = 0;
  local_23c0 = vbroadcastss_avx512vl(auVar52);
  auVar91 = ZEXT3264(local_23c0);
  auVar57._4_4_ = fVar28;
  auVar57._0_4_ = fVar28;
  auVar57._8_4_ = fVar28;
  auVar57._12_4_ = fVar28;
  auVar57._16_4_ = fVar28;
  auVar57._20_4_ = fVar28;
  auVar57._24_4_ = fVar28;
  auVar57._28_4_ = fVar28;
  auVar80._8_4_ = 0x80000000;
  auVar80._0_8_ = 0x8000000080000000;
  auVar80._12_4_ = 0x80000000;
  auVar80._16_4_ = 0x80000000;
  auVar80._20_4_ = 0x80000000;
  auVar80._24_4_ = 0x80000000;
  auVar80._28_4_ = 0x80000000;
  local_23e0 = vxorps_avx512vl(auVar57,auVar80);
  auVar92 = ZEXT3264(local_23e0);
  local_2400 = vbroadcastsd_avx512vl(auVar34);
  auVar93 = ZEXT3264(local_2400);
  auVar58._8_4_ = 1;
  auVar58._0_8_ = 0x100000001;
  auVar58._12_4_ = 1;
  auVar58._16_4_ = 1;
  auVar58._20_4_ = 1;
  auVar58._24_4_ = 1;
  auVar58._28_4_ = 1;
  auVar57 = ZEXT1632(CONCAT412(fVar61 * fVar3,
                               CONCAT48(fVar60 * fVar2,CONCAT44(fVar59 * fVar1,fVar28))));
  auVar56 = vpermps_avx2(auVar58,auVar57);
  local_2420 = vxorps_avx512vl(auVar56,auVar80);
  auVar94 = ZEXT3264(local_2420);
  auVar82._8_4_ = 2;
  auVar82._0_8_ = 0x200000002;
  auVar82._12_4_ = 2;
  auVar82._16_4_ = 2;
  auVar82._20_4_ = 2;
  auVar82._24_4_ = 2;
  auVar82._28_4_ = 2;
  local_2440 = vpermps_avx512vl(auVar82,ZEXT1632(auVar52));
  auVar95 = ZEXT3264(local_2440);
  auVar56 = vpermps_avx2(auVar82,auVar57);
  local_2460 = vxorps_avx512vl(auVar56,auVar80);
  auVar96 = ZEXT3264(local_2460);
  local_2480 = vbroadcastss_avx512vl(auVar54);
  auVar97 = ZEXT3264(local_2480);
  auVar56._4_4_ = fVar66;
  auVar56._0_4_ = fVar66;
  auVar56._8_4_ = fVar66;
  auVar56._12_4_ = fVar66;
  auVar56._16_4_ = fVar66;
  auVar56._20_4_ = fVar66;
  auVar56._24_4_ = fVar66;
  auVar56._28_4_ = fVar66;
  local_24a0 = vxorps_avx512vl(auVar56,auVar80);
  auVar98 = ZEXT3264(local_24a0);
  local_24c0 = vpermps_avx512vl(auVar58,ZEXT1632(auVar54));
  auVar99 = ZEXT3264(local_24c0);
  auVar57 = ZEXT1632(CONCAT412(fVar70,CONCAT48(fVar69,CONCAT44(fVar68,fVar66))));
  auVar56 = vpermps_avx2(auVar58,auVar57);
  local_24e0 = vxorps_avx512vl(auVar56,auVar80);
  auVar100 = ZEXT3264(local_24e0);
  local_2500 = vpermps_avx512vl(auVar82,ZEXT1632(auVar54));
  auVar101 = ZEXT3264(local_2500);
  auVar56 = vpermps_avx2(auVar82,auVar57);
  local_2520 = vxorps_avx512vl(auVar56,auVar80);
  auVar102 = ZEXT3264(local_2520);
  local_2540 = vbroadcastss_avx512vl(auVar31);
  auVar103 = ZEXT3264(local_2540);
  auVar63._8_4_ = 0x7f800000;
  auVar63._0_8_ = 0x7f8000007f800000;
  auVar63._12_4_ = 0x7f800000;
  auVar36 = vpblendmd_avx512vl(auVar63,local_25d0);
  local_2630._0_4_ = (uint)(bVar26 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar26 & 1) * (int)fVar66;
  bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
  local_2630._4_4_ = (uint)bVar25 * auVar36._4_4_ | (uint)!bVar25 * (int)fVar68;
  bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
  local_2630._8_4_ = (uint)bVar25 * auVar36._8_4_ | (uint)!bVar25 * (int)fVar69;
  bVar25 = SUB81(uVar27 >> 3,0);
  local_2630._12_4_ = (uint)bVar25 * auVar36._12_4_ | (uint)!bVar25 * (int)fVar70;
  auVar65 = ZEXT1664(auVar53);
  auVar36 = vmovdqa64_avx512vl(local_2630);
  in_ZMM17 = ZEXT1664(auVar36);
  auVar87 = ZEXT1664(CONCAT412(fStack_2684,CONCAT48(fStack_2688,CONCAT44(fStack_268c,local_2690))));
  puVar24 = local_2390;
  local_2658 = 0;
  local_2660 = 0x40;
  lVar22 = 0;
  lVar23 = 0x40;
LAB_01dc4d23:
  local_2620 = auVar65._0_16_;
  auVar64._0_4_ = auVar65._0_4_;
  auVar64._4_4_ = auVar64._0_4_;
  auVar64._8_4_ = auVar64._0_4_;
  auVar64._12_4_ = auVar64._0_4_;
  auVar64._16_4_ = auVar64._0_4_;
  auVar64._20_4_ = auVar64._0_4_;
  auVar64._24_4_ = auVar64._0_4_;
  auVar64._28_4_ = auVar64._0_4_;
  do {
    if (puVar24 == &local_23a0) {
      if (local_2668 == 0) {
        return;
      }
      goto LAB_01dc4960;
    }
    uVar7 = (undefined4)puVar24[-1];
    auVar67._4_4_ = uVar7;
    auVar67._0_4_ = uVar7;
    auVar67._8_4_ = uVar7;
    auVar67._12_4_ = uVar7;
    auVar65 = ZEXT1664(auVar67);
    puVar24 = puVar24 + -2;
    local_2550 = in_ZMM18._0_16_;
    uVar12 = vcmpps_avx512vl(auVar67,local_2550,1);
    if ((char)uVar12 != '\0') {
      uVar17 = *puVar24;
      while( true ) {
        if ((uVar17 & 8) != 0) {
          uVar12 = vcmpps_avx512vl(local_2550,auVar65._0_16_,6);
          local_2600[0].v = (char)uVar12;
          if ((char)uVar12 == '\0') {
            auVar65 = ZEXT1664(local_2620);
          }
          else {
            local_2640 = (ulong)((uint)uVar17 & 0xf) - 8;
            prim = (Primitive_conflict4 *)(uVar17 & 0xfffffffffffffff0);
            while (bVar25 = local_2640 != 0, local_2640 = local_2640 + -1, bVar25) {
              auVar83 = ZEXT1664(auVar83._0_16_);
              InstanceArrayIntersectorK<4>::intersect(local_2600,&local_26a1,ray,local_2648,prim);
              in_ZMM18 = ZEXT1664(local_2550);
              auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar90 = ZEXT1664(auVar36);
              auVar89 = ZEXT1664(local_2590);
              auVar88 = ZEXT1664(local_2580);
              auVar86 = ZEXT1664(local_2570);
              auVar85 = ZEXT1664(local_2560);
              prim = prim + 1;
              ray = local_2650;
            }
            auVar36 = *(undefined1 (*) [16])(ray + 0x80);
            uVar12 = vcmpps_avx512vl(auVar36,in_ZMM18._0_16_,1);
            auVar91 = ZEXT3264(local_23c0);
            auVar92 = ZEXT3264(local_23e0);
            auVar93 = ZEXT3264(local_2400);
            auVar94 = ZEXT3264(local_2420);
            auVar95 = ZEXT3264(local_2440);
            auVar96 = ZEXT3264(local_2460);
            auVar97 = ZEXT3264(local_2480);
            auVar98 = ZEXT3264(local_24a0);
            auVar99 = ZEXT3264(local_24c0);
            auVar100 = ZEXT3264(local_24e0);
            auVar101 = ZEXT3264(local_2500);
            auVar102 = ZEXT3264(local_2520);
            auVar103 = ZEXT3264(local_2540);
            if ((local_2600[0].v & (byte)uVar12) != 0) {
              auVar55._0_4_ =
                   (uint)(local_2600[0].v & 1) * auVar36._0_4_ |
                   (uint)!(bool)(local_2600[0].v & 1) * in_ZMM18._0_4_;
              bVar25 = (bool)(local_2600[0].v >> 1 & 1);
              auVar55._4_4_ = (uint)bVar25 * auVar36._4_4_ | (uint)!bVar25 * in_ZMM18._4_4_;
              bVar25 = (bool)(local_2600[0].v >> 2 & 1);
              auVar55._8_4_ = (uint)bVar25 * auVar36._8_4_ | (uint)!bVar25 * in_ZMM18._8_4_;
              bVar25 = (bool)(local_2600[0].v >> 3 & 1);
              auVar55._12_4_ = (uint)bVar25 * auVar36._12_4_ | (uint)!bVar25 * in_ZMM18._12_4_;
              in_ZMM18 = ZEXT1664(auVar55);
              auVar36 = vshufps_avx512vl(auVar55,auVar55,0xb1);
              auVar35 = vmaxps_avx512vl(auVar36,auVar55);
              auVar36 = vshufpd_avx(auVar35,auVar35,1);
              local_2620 = vmaxss_avx(auVar36,auVar35);
            }
            auVar87 = ZEXT1664(CONCAT412(fStack_2684,
                                         CONCAT48(fStack_2688,CONCAT44(fStack_268c,local_2690))));
            auVar84 = ZEXT1664(local_2680);
            auVar65 = ZEXT1664(local_2620);
            auVar36 = vmovdqa64_avx512vl(local_2630);
            in_ZMM17 = ZEXT1664(auVar36);
            lVar22 = local_2658;
            lVar23 = local_2660;
          }
          goto LAB_01dc4d23;
        }
        auVar56 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar17 + 0x40 + lVar22),auVar92._0_32_,
                             auVar91._0_32_);
        auVar57 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar17 + 0x40 + lVar23),auVar94._0_32_,
                             auVar93._0_32_);
        auVar56 = vpmaxsd_avx2(auVar56,auVar57);
        auVar57 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar17 + 0xc0),auVar96._0_32_,auVar95._0_32_);
        auVar57 = vpmaxsd_avx512vl(auVar57,auVar103._0_32_);
        auVar56 = vpmaxsd_avx2(auVar56,auVar57);
        auVar57 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar17 + 0x60),auVar98._0_32_,auVar97._0_32_);
        auVar58 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar17 + 0x40 + local_2638),auVar100._0_32_,
                             auVar99._0_32_);
        auVar57 = vpminsd_avx2(auVar57,auVar58);
        auVar58 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar17 + 0xe0),auVar102._0_32_,auVar101._0_32_);
        auVar58 = vpminsd_avx2(auVar58,auVar64);
        auVar57 = vpminsd_avx2(auVar57,auVar58);
        local_2600[0].v = auVar56[0];
        local_2600[1].v = auVar56[1];
        local_2600[2].v = auVar56[2];
        local_2600[3].v = auVar56[3];
        local_2600[4].v = auVar56[4];
        local_2600[5].v = auVar56[5];
        local_2600[6].v = auVar56[6];
        local_2600[7].v = auVar56[7];
        local_2600[8].v = auVar56[8];
        local_2600[9].v = auVar56[9];
        local_2600[10].v = auVar56[10];
        local_2600[0xb].v = auVar56[0xb];
        local_2600[0xc].v = auVar56[0xc];
        local_2600[0xd].v = auVar56[0xd];
        local_2600[0xe].v = auVar56[0xe];
        local_2600[0xf].v = auVar56[0xf];
        local_2600[0x10].v = auVar56[0x10];
        local_2600[0x11].v = auVar56[0x11];
        local_2600[0x12].v = auVar56[0x12];
        local_2600[0x13].v = auVar56[0x13];
        local_2600[0x14].v = auVar56[0x14];
        local_2600[0x15].v = auVar56[0x15];
        local_2600[0x16].v = auVar56[0x16];
        local_2600[0x17].v = auVar56[0x17];
        local_2600[0x18].v = auVar56[0x18];
        local_2600[0x19].v = auVar56[0x19];
        local_2600[0x1a].v = auVar56[0x1a];
        local_2600[0x1b].v = auVar56[0x1b];
        local_2600[0x1c].v = auVar56[0x1c];
        local_2600[0x1d].v = auVar56[0x1d];
        local_2600[0x1e].v = auVar56[0x1e];
        local_2600[0x1f].v = auVar56[0x1f];
        uVar27 = vcmpps_avx512vl(auVar56,auVar57,2);
        if ((char)uVar27 == '\0') break;
        auVar65 = ZEXT1664(auVar90._0_16_);
        uVar20 = 0;
        uVar18 = 8;
        do {
          lVar14 = 0;
          for (uVar19 = uVar27; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          uVar7 = *(undefined4 *)(uVar17 + 0x40 + lVar14 * 4);
          auVar71._4_4_ = uVar7;
          auVar71._0_4_ = uVar7;
          auVar71._8_4_ = uVar7;
          auVar71._12_4_ = uVar7;
          auVar29 = vfmadd132ps_fma(auVar71,auVar87._0_16_,auVar84._0_16_);
          uVar7 = *(undefined4 *)(uVar17 + 0x80 + lVar14 * 4);
          auVar73._4_4_ = uVar7;
          auVar73._0_4_ = uVar7;
          auVar73._8_4_ = uVar7;
          auVar73._12_4_ = uVar7;
          auVar30 = vfmadd132ps_fma(auVar73,auVar88._0_16_,auVar85._0_16_);
          uVar7 = *(undefined4 *)(uVar17 + 0xc0 + lVar14 * 4);
          auVar74._4_4_ = uVar7;
          auVar74._0_4_ = uVar7;
          auVar74._8_4_ = uVar7;
          auVar74._12_4_ = uVar7;
          auVar31 = vfmadd132ps_fma(auVar74,auVar89._0_16_,auVar86._0_16_);
          uVar7 = *(undefined4 *)(uVar17 + 0x60 + lVar14 * 4);
          auVar77._4_4_ = uVar7;
          auVar77._0_4_ = uVar7;
          auVar77._8_4_ = uVar7;
          auVar77._12_4_ = uVar7;
          auVar34 = vfmadd132ps_fma(auVar77,auVar87._0_16_,auVar84._0_16_);
          uVar7 = *(undefined4 *)(uVar17 + 0xa0 + lVar14 * 4);
          auVar79._4_4_ = uVar7;
          auVar79._0_4_ = uVar7;
          auVar79._8_4_ = uVar7;
          auVar79._12_4_ = uVar7;
          auVar53 = vfmadd132ps_fma(auVar79,auVar88._0_16_,auVar85._0_16_);
          uVar7 = *(undefined4 *)(uVar17 + 0xe0 + lVar14 * 4);
          auVar81._4_4_ = uVar7;
          auVar81._0_4_ = uVar7;
          auVar81._8_4_ = uVar7;
          auVar81._12_4_ = uVar7;
          auVar32 = vfmadd132ps_fma(auVar81,auVar89._0_16_,auVar86._0_16_);
          auVar36 = vpminsd_avx(auVar29,auVar34);
          auVar35 = vpminsd_avx(auVar30,auVar53);
          auVar36 = vpmaxsd_avx(auVar36,auVar35);
          auVar35 = vpminsd_avx(auVar31,auVar32);
          auVar35 = vpmaxsd_avx512vl(auVar35,in_ZMM17._0_16_);
          auVar83 = ZEXT1664(auVar35);
          auVar36 = vpmaxsd_avx(auVar36,auVar35);
          auVar35 = vpmaxsd_avx(auVar29,auVar34);
          auVar29 = vpmaxsd_avx(auVar30,auVar53);
          auVar29 = vpminsd_avx(auVar35,auVar29);
          auVar35 = vpmaxsd_avx(auVar31,auVar32);
          auVar35 = vpminsd_avx512vl(auVar35,local_2550);
          auVar35 = vpminsd_avx(auVar29,auVar35);
          uVar13 = vpcmpd_avx512vl(auVar36,auVar35,2);
          uVar19 = uVar18;
          if ((uVar13 & 0xf) != 0) {
            uVar7 = *(undefined4 *)(local_2600 + lVar14 * 4);
            auVar72._4_4_ = uVar7;
            auVar72._0_4_ = uVar7;
            auVar72._8_4_ = uVar7;
            auVar72._12_4_ = uVar7;
            uVar19 = *(ulong *)(uVar17 + lVar14 * 8);
            auVar36 = auVar65._0_16_;
            uVar12 = vcmpps_avx512vl(auVar72,auVar36,1);
            if ((char)uVar12 == '\0') {
              *puVar24 = uVar19;
              uVar19 = uVar18;
            }
            else {
              if (uVar18 == 8) {
                auVar65 = ZEXT1664(auVar72);
                goto LAB_01dc4f09;
              }
              *puVar24 = uVar18;
              auVar65 = ZEXT1664(auVar72);
              auVar72 = auVar36;
            }
            uVar20 = uVar20 + 1;
            *(int *)(puVar24 + 1) = auVar72._0_4_;
            puVar24 = puVar24 + 2;
          }
LAB_01dc4f09:
          uVar27 = uVar27 - 1 & uVar27;
          uVar18 = uVar19;
        } while (uVar27 != 0);
        if (uVar19 == 8) break;
        uVar17 = uVar19;
        if (1 < uVar20) {
          puVar4 = puVar24 + -4;
          puVar5 = puVar24 + -2;
          if ((uint)puVar24[-3] < (uint)puVar24[-1]) {
            local_26a0 = *puVar4;
            uStack_2698 = puVar24[-3];
            *(int *)(puVar24 + -3) = (int)puVar24[-1];
            *puVar4 = *puVar5;
            *puVar5 = local_26a0;
            *(undefined4 *)(puVar24 + -1) = (undefined4)uStack_2698;
          }
          if (uVar20 != 2) {
            puVar6 = puVar24 + -6;
            uVar21 = (uint)puVar24[-5];
            if (uVar21 < (uint)puVar24[-1]) {
              local_26a0 = *puVar6;
              uStack_2698 = puVar24[-5];
              *(int *)(puVar24 + -5) = (int)puVar24[-1];
              *puVar6 = *puVar5;
              *puVar5 = local_26a0;
              *(undefined4 *)(puVar24 + -1) = (undefined4)uStack_2698;
              uVar21 = (uint)puVar24[-5];
            }
            if (uVar21 < (uint)puVar24[-3]) {
              local_26a0 = *puVar6;
              uStack_2698 = puVar24[-5];
              *(int *)(puVar24 + -5) = (int)puVar24[-3];
              *puVar6 = *puVar4;
              *puVar4 = local_26a0;
              *(undefined4 *)(puVar24 + -3) = (undefined4)uStack_2698;
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }